

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

double matrix4_determinant(matrix4 *self)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = (self->field_0).m[5];
  dVar2 = (self->field_0).m[0];
  dVar3 = (self->field_0).m[1];
  dVar4 = (self->field_0).m[10];
  dVar5 = (self->field_0).m[0xf];
  dVar6 = (self->field_0).m[6];
  dVar7 = (self->field_0).m[0xb];
  dVar8 = (self->field_0).m[0xd];
  dVar9 = (self->field_0).m[7];
  dVar10 = (self->field_0).m[9];
  dVar11 = (self->field_0).m[0xe];
  dVar12 = (self->field_0).m[4];
  dVar13 = (self->field_0).m[8];
  dVar14 = (self->field_0).m[0xc];
  dVar15 = (self->field_0).m[2];
  dVar16 = (self->field_0).m[3];
  return ((((((((((((dVar10 * dVar6 * dVar16 * dVar14 +
                    dVar13 * dVar1 * dVar16 * dVar11 +
                    dVar4 * dVar12 * dVar16 * dVar8 +
                    dVar13 * dVar9 * dVar15 * dVar8 +
                    dVar7 * dVar1 * dVar15 * dVar14 +
                    dVar10 * dVar12 * dVar15 * dVar5 +
                    dVar4 * dVar3 * dVar9 * dVar14 +
                    dVar6 * dVar3 * dVar13 * dVar5 +
                    dVar7 * dVar3 * dVar12 * dVar11 +
                    dVar2 * dVar9 * dVar10 * dVar11 +
                    dVar2 * dVar1 * dVar4 * dVar5 + dVar2 * dVar6 * dVar7 * dVar8) -
                   dVar2 * dVar1 * dVar7 * dVar11) - dVar2 * dVar6 * dVar10 * dVar5) -
                 dVar2 * dVar9 * dVar4 * dVar8) - dVar3 * dVar12 * dVar4 * dVar5) -
               dVar6 * dVar3 * dVar7 * dVar14) - dVar3 * dVar9 * dVar13 * dVar11) -
             dVar12 * dVar15 * dVar7 * dVar8) - dVar1 * dVar15 * dVar13 * dVar5) -
           dVar9 * dVar15 * dVar10 * dVar14) - dVar12 * dVar16 * dVar10 * dVar11) -
         dVar1 * dVar16 * dVar4 * dVar14) - dVar6 * dVar16 * dVar13 * dVar8;
}

Assistant:

HYPAPI HYP_FLOAT matrix4_determinant(const struct matrix4 *self)
{
	HYP_FLOAT determinant;

	/* using the Leibniz formula */
	/* avoids temporary structures */

	determinant =
	  A4(11, 22, 33, 44) + A4(11, 23, 34, 42) + A4(11, 24, 32, 43)
	+ A4(12, 21, 34, 43) + A4(12, 23, 31, 44) + A4(12, 24, 33, 41)
	+ A4(13, 21, 32, 44) + A4(13, 22, 34, 41) + A4(13, 24, 31, 42)
	+ A4(14, 21, 33, 42) + A4(14, 22, 31, 43) + A4(14, 23, 32, 41)
	- A4(11, 22, 34, 43) - A4(11, 23, 32, 44) - A4(11, 24, 33, 42)
	- A4(12, 21, 33, 44) - A4(12, 23, 34, 41) - A4(12, 24, 31, 43)
	- A4(13, 21, 34, 42) - A4(13, 22, 31, 44) - A4(13, 24, 32, 41)
	- A4(14, 21, 32, 43) - A4(14, 22, 33, 41) - A4(14, 23, 31, 42)
	;

	return determinant;
}